

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O3

bool __thiscall crunch::process_files(crunch *this,file_desc_vec *files)

{
  command_line_params *this_00;
  file_desc *pfVar1;
  crunch *this_01;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  format fVar7;
  convert_status cVar8;
  param_map_const_iterator pVar9;
  char *pcVar10;
  dynamic_string *pdVar11;
  ssize_t sVar12;
  size_t __nbytes;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  uint32 file_index;
  ulong uVar16;
  char *pcVar17;
  dynamic_string out_name;
  dynamic_string out_dir;
  dynamic_string fmt;
  dynamic_string out_ext;
  dynamic_string in_fname;
  dynamic_string in_path;
  dynamic_string in_drive;
  cfile_stream in_stream;
  dynamic_string in_ext;
  dynamic_string out_filename;
  format local_170;
  dynamic_string local_158;
  file_desc_vec *local_148;
  dynamic_string local_140;
  dynamic_string local_130;
  crunch *local_120;
  _Base_ptr local_118;
  dynamic_string local_110;
  dynamic_string local_100;
  dynamic_string local_f0;
  dynamic_string local_e0;
  undefined1 local_d0 [8];
  char *local_c8;
  FILE *local_b0;
  undefined1 uStack_a8;
  undefined7 uStack_a7;
  undefined1 uStack_a0;
  undefined8 uStack_9f;
  dynamic_string local_90;
  dynamic_string local_80;
  byte local_6e;
  
  this_00 = &this->m_params;
  bVar2 = crnlib::command_line_params::get_value_as_bool(this_00,"compare",0,false);
  bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"info",0,false);
  if (files->m_size != 0) {
    local_118 = &(this->m_params).m_param_map._M_t._M_impl.super__Rb_tree_header._M_header;
    lVar15 = 8;
    uVar16 = 0;
    local_148 = files;
    local_120 = this;
    do {
      pfVar1 = files->m_p;
      local_e0.m_buf_size = 0;
      local_e0.m_len = 0;
      local_e0.m_pStr = (char *)0x0;
      local_f0.m_buf_size = 0;
      local_f0.m_len = 0;
      local_f0.m_pStr = (char *)0x0;
      local_100.m_buf_size = 0;
      local_100.m_len = 0;
      local_100.m_pStr = (char *)0x0;
      local_90.m_buf_size = 0;
      local_90.m_len = 0;
      local_90.m_pStr = (char *)0x0;
      pcVar14 = *(char **)((long)&(pfVar1->m_fullname).m_buf_size + lVar15);
      if (pcVar14 == (char *)0x0) {
        pcVar14 = "";
      }
      crnlib::file_utils::split_path(pcVar14,&local_e0,&local_f0,&local_100,&local_90);
      local_130.m_buf_size = 0;
      local_130.m_len = 0;
      local_130.m_pStr = (char *)0x0;
      bVar4 = crnlib::command_line_params::get_value_as_string(this_00,"fileformat",0,&local_130,0);
      local_170 = cFormatCRN;
      if (bVar4) {
        iVar6 = crnlib::dynamic_string::compare(&local_130,"tga",false);
        if (iVar6 == 0) {
          local_170 = cFormatTGA;
          goto LAB_0010b9e8;
        }
        iVar6 = crnlib::dynamic_string::compare(&local_130,"bmp",false);
        if (iVar6 == 0) {
          local_170 = cFormatBMP;
          goto LAB_0010b9e8;
        }
        iVar6 = crnlib::dynamic_string::compare(&local_130,"dds",false);
        if (iVar6 == 0) {
          local_170 = cFormatDDS;
          goto LAB_0010b9e8;
        }
        iVar6 = crnlib::dynamic_string::compare(&local_130,"ktx",false);
        if (iVar6 == 0) {
          local_170 = cFormatKTX;
          goto LAB_0010b9e8;
        }
        iVar6 = crnlib::dynamic_string::compare(&local_130,"crn",false);
        if (iVar6 == 0) goto LAB_0010b9e8;
        iVar6 = crnlib::dynamic_string::compare(&local_130,"png",false);
        if (iVar6 == 0) {
          local_170 = cFormatPNG;
          goto LAB_0010b9e8;
        }
        pcVar14 = local_130.m_pStr;
        if (local_130.m_pStr == (char *)0x0) {
          pcVar14 = "";
        }
        bVar4 = true;
        crnlib::console::error("Unsupported output file type: %s",pcVar14);
      }
      else {
LAB_0010b9e8:
        pVar9 = crnlib::command_line_params::get_param(this_00,"fileformat",0);
        if (pVar9._M_node == local_118) {
          pVar9 = crnlib::command_line_params::get_param(this_00,"split",0);
          if (pVar9._M_node == local_118) {
            pcVar14 = *(char **)((long)&(pfVar1->m_fullname).m_buf_size + lVar15);
            if (pcVar14 == (char *)0x0) {
              pcVar14 = "";
            }
            fVar7 = crnlib::texture_file_types::determine_file_format(pcVar14);
            if (fVar7 != cFormatKTX) {
              if (fVar7 == cFormatCRN) {
                crnlib::data_stream::data_stream((data_stream *)local_d0);
                local_d0 = (undefined1  [8])&PTR__cfile_stream_001dae30;
                uStack_a0 = 0;
                uStack_9f = 0;
                local_b0 = (FILE *)0x0;
                uStack_a8 = 0;
                uStack_a7 = 0;
                pcVar14 = *(char **)((long)&(pfVar1->m_fullname).m_buf_size + lVar15);
                if (pcVar14 == (char *)0x0) {
                  pcVar14 = "";
                }
                __nbytes = 0;
                iVar6 = crnlib::cfile_stream::open((cfile_stream *)local_d0,pcVar14,5);
                local_170 = cFormatDDS;
                if (((char)iVar6 != '\0') &&
                   (sVar12 = crnlib::cfile_stream::read
                                       ((cfile_stream *)local_d0,(int)&local_80,(void *)0x4a,
                                        __nbytes), (int)sVar12 == 0x4a)) {
                  local_170 = (uint)(local_6e - 10 < 5) * 2;
                }
                crnlib::cfile_stream::~cfile_stream((cfile_stream *)local_d0);
              }
              goto LAB_0010ba25;
            }
          }
          local_170 = cFormatPNG;
        }
LAB_0010ba25:
        local_80.m_buf_size = 0;
        local_80.m_len = 0;
        local_80.m_pStr = (char *)0x0;
        bVar4 = crnlib::command_line_params::get_value_as_bool(this_00,"outsamedir",0,false);
        pcVar13 = local_e0.m_pStr;
        pcVar17 = local_f0.m_pStr;
        pcVar14 = local_100.m_pStr;
        file_index = (uint32)uVar16;
        if (bVar4) {
          pcVar10 = crnlib::texture_file_types::get_extension(local_170);
          if (pcVar14 == (char *)0x0) {
            pcVar14 = "";
          }
          if (pcVar17 == (char *)0x0) {
            pcVar17 = "";
          }
          if (pcVar13 == (char *)0x0) {
            pcVar13 = "";
          }
          crnlib::dynamic_string::format(&local_80,"%s%s%s.%s",pcVar13,pcVar17,pcVar14,pcVar10);
        }
        else {
          pVar9 = crnlib::command_line_params::get_param(this_00,"out",0);
          if (pVar9._M_node == local_118) {
            pdVar11 = crnlib::command_line_params::get_value_as_string_or_empty
                                (this_00,"outdir",0,0);
            crnlib::dynamic_string::dynamic_string((dynamic_string *)local_d0,pdVar11);
            bVar4 = crnlib::command_line_params::get_value_as_bool(this_00,"recreate",0,false);
            if ((bVar4) && (*(short *)((long)&(pfVar1->m_base).m_pStr + lVar15 + 2) != 0)) {
              pcVar14 = local_c8;
              if (local_c8 == (char *)0x0) {
                pcVar14 = "";
              }
              pcVar17 = *(char **)((long)&(pfVar1->m_rel).m_buf_size + lVar15);
              if (pcVar17 == (char *)0x0) {
                pcVar17 = "";
              }
              crnlib::file_utils::combine_path((dynamic_string *)local_d0,pcVar14,pcVar17);
            }
            pcVar14 = local_100.m_pStr;
            if (local_d0._2_2_ == 0) {
              crnlib::texture_file_types::get_extension(local_170);
              if (pcVar14 == (char *)0x0) {
                pcVar14 = "";
              }
              crnlib::dynamic_string::format(&local_80,"%s.%s",pcVar14);
            }
            else {
              bVar4 = crnlib::file_utils::is_path_separator(local_c8[(ushort)local_d0._2_2_ - 1]);
              pcVar14 = local_c8;
              if (bVar4) {
                crnlib::texture_file_types::get_extension(local_170);
                pcVar17 = "%s%s.%s";
              }
              else {
                crnlib::texture_file_types::get_extension(local_170);
                pcVar17 = "%s\\%s.%s";
              }
              if (pcVar14 == (char *)0x0) {
                pcVar14 = "";
              }
              crnlib::dynamic_string::format(&local_80,pcVar17,pcVar14);
            }
            bVar4 = crnlib::command_line_params::get_value_as_bool(this_00,"recreate",0,false);
            if ((bVar4) &&
               (bVar4 = crnlib::file_utils::full_path(&local_80), bVar4 && (!bVar2 && !bVar3))) {
              local_140.m_buf_size = 0;
              local_140.m_len = 0;
              local_140.m_pStr = (char *)0x0;
              local_158.m_buf_size = 0;
              local_158.m_len = 0;
              local_158.m_pStr = (char *)0x0;
              pcVar14 = local_80.m_pStr;
              if (local_80.m_pStr == (char *)0x0) {
                pcVar14 = "";
              }
              crnlib::file_utils::split_path
                        (pcVar14,&local_140,&local_158,(dynamic_string *)0x0,(dynamic_string *)0x0);
              crnlib::dynamic_string::append(&local_140,&local_158);
              pcVar14 = local_140.m_pStr;
              if (local_140.m_pStr == (char *)0x0) {
                pcVar14 = "";
              }
              crnlib::dynamic_string::dynamic_string(&local_110,pcVar14);
              crnlib::file_utils::create_path(&local_110);
              if ((local_110.m_pStr != (char *)0x0) &&
                 ((*(uint *)(local_110.m_pStr + -8) ^ *(uint *)(local_110.m_pStr + -4)) ==
                  0xffffffff)) {
                crnlib::crnlib_free(local_110.m_pStr + -0x10);
              }
              if ((local_158.m_pStr != (char *)0x0) &&
                 ((*(uint *)(local_158.m_pStr + -8) ^ *(uint *)(local_158.m_pStr + -4)) ==
                  0xffffffff)) {
                crnlib::crnlib_free(local_158.m_pStr + -0x10);
              }
              if ((local_140.m_pStr != (char *)0x0) &&
                 ((*(uint *)(local_140.m_pStr + -8) ^ *(uint *)(local_140.m_pStr + -4)) ==
                  0xffffffff)) {
                crnlib::crnlib_free(local_140.m_pStr + -0x10);
              }
            }
            if ((local_c8 != (char *)0x0) &&
               ((*(uint *)(local_c8 + -8) ^ *(uint *)(local_c8 + -4)) == 0xffffffff)) {
              crnlib::crnlib_free(local_c8 + -0x10);
            }
          }
          else {
            pdVar11 = crnlib::command_line_params::get_value_as_string_or_empty(this_00,"out",0,0);
            crnlib::dynamic_string::set(&local_80,pdVar11,0xffffffff);
            if (1 < local_148->m_size) {
              local_d0 = (undefined1  [8])((ulong)local_d0 & 0xffffffff00000000);
              local_c8 = (char *)0x0;
              local_140.m_buf_size = 0;
              local_140.m_len = 0;
              local_140.m_pStr = (char *)0x0;
              local_158.m_buf_size = 0;
              local_158.m_len = 0;
              local_158.m_pStr = (char *)0x0;
              local_110.m_buf_size = 0;
              local_110.m_len = 0;
              local_110.m_pStr = (char *)0x0;
              pcVar14 = local_80.m_pStr;
              if (local_80.m_pStr == (char *)0x0) {
                pcVar14 = "";
              }
              crnlib::file_utils::split_path
                        (pcVar14,(dynamic_string *)local_d0,&local_140,&local_158,&local_110);
              pcVar14 = local_158.m_pStr;
              if (local_158.m_pStr == (char *)0x0) {
                pcVar14 = "";
              }
              crnlib::dynamic_string::format(&local_158,"%s_%u",pcVar14,uVar16 & 0xffffffff);
              pcVar14 = local_c8;
              if (local_c8 == (char *)0x0) {
                pcVar14 = "";
              }
              pcVar17 = local_140.m_pStr;
              if (local_140.m_pStr == (char *)0x0) {
                pcVar17 = "";
              }
              pcVar13 = local_158.m_pStr;
              if (local_158.m_pStr == (char *)0x0) {
                pcVar13 = "";
              }
              pcVar10 = local_110.m_pStr;
              if (local_110.m_pStr == (char *)0x0) {
                pcVar10 = "";
              }
              crnlib::dynamic_string::format(&local_80,"%s%s%s%s",pcVar14,pcVar17,pcVar13,pcVar10);
              if ((local_110.m_pStr != (char *)0x0) &&
                 ((*(uint *)(local_110.m_pStr + -8) ^ *(uint *)(local_110.m_pStr + -4)) ==
                  0xffffffff)) {
                crnlib::crnlib_free(local_110.m_pStr + -0x10);
              }
              if ((local_158.m_pStr != (char *)0x0) &&
                 ((*(uint *)(local_158.m_pStr + -8) ^ *(uint *)(local_158.m_pStr + -4)) ==
                  0xffffffff)) {
                crnlib::crnlib_free(local_158.m_pStr + -0x10);
              }
              if ((local_140.m_pStr != (char *)0x0) &&
                 ((*(uint *)(local_140.m_pStr + -8) ^ *(uint *)(local_140.m_pStr + -4)) ==
                  0xffffffff)) {
                crnlib::crnlib_free(local_140.m_pStr + -0x10);
              }
              if ((local_c8 != (char *)0x0) &&
                 ((*(uint *)(local_c8 + -8) ^ *(uint *)(local_c8 + -4)) == 0xffffffff)) {
                crnlib::crnlib_free(local_c8 + -0x10);
              }
            }
            pVar9 = crnlib::command_line_params::get_param(this_00,"fileformat",0);
            if (pVar9._M_node == local_118) {
              pcVar14 = local_80.m_pStr;
              if (local_80.m_pStr == (char *)0x0) {
                pcVar14 = "";
              }
              local_170 = crnlib::texture_file_types::determine_file_format(pcVar14);
            }
          }
        }
        if (bVar2 || bVar3) {
LAB_0010c075:
          this_01 = local_120;
          files = local_148;
          if (bVar3) {
            pcVar14 = *(char **)((long)&(pfVar1->m_fullname).m_buf_size + lVar15);
            if (pcVar14 == (char *)0x0) {
              pcVar14 = "";
            }
            cVar8 = display_file_info(local_120,file_index,local_148->m_size,pcVar14);
LAB_0010c13e:
            this_01->m_num_processed = this_01->m_num_processed + 1;
            if (cVar8 != cCSBadParam) {
              if (cVar8 == cCSSkipped) {
                crnlib::console::info("Skipping file.\n");
                this_01->m_num_skipped = this_01->m_num_skipped + 1;
              }
              else {
                if (cVar8 != cCSSucceeded) goto LAB_0010c17c;
                crnlib::console::info("");
                this_01->m_num_succeeded = this_01->m_num_succeeded + 1;
              }
              goto LAB_0010c1a7;
            }
            bVar4 = true;
          }
          else {
            if (bVar2) {
              pcVar14 = *(char **)((long)&(pfVar1->m_fullname).m_buf_size + lVar15);
              if (pcVar14 == (char *)0x0) {
                pcVar14 = "";
              }
              pcVar17 = local_80.m_pStr;
              if (local_80.m_pStr == (char *)0x0) {
                pcVar17 = "";
              }
              cVar8 = compare_file(local_120,file_index,local_148->m_size,pcVar14,pcVar17,local_170)
              ;
              goto LAB_0010c13e;
            }
            pcVar14 = local_80.m_pStr;
            if (local_80.m_pStr == (char *)0x0) {
              pcVar14 = "";
            }
            bVar4 = read_only_file_check(local_120,pcVar14);
            if (bVar4) {
              pcVar14 = *(char **)((long)&(pfVar1->m_fullname).m_buf_size + lVar15);
              if (pcVar14 == (char *)0x0) {
                pcVar14 = "";
              }
              pcVar17 = local_80.m_pStr;
              if (local_80.m_pStr == (char *)0x0) {
                pcVar17 = "";
              }
              cVar8 = convert_file(this_01,file_index,files->m_size,pcVar14,pcVar17,local_170);
              goto LAB_0010c13e;
            }
            this_01->m_num_processed = this_01->m_num_processed + 1;
LAB_0010c17c:
            bVar5 = crnlib::command_line_params::get_value_as_bool(this_00,"ignoreerrors",0,false);
            bVar4 = true;
            if (bVar5) {
              crnlib::console::info("");
              this_01->m_num_failed = this_01->m_num_failed + 1;
LAB_0010c1a7:
              bVar4 = false;
            }
          }
        }
        else {
          pcVar14 = local_80.m_pStr;
          if (local_80.m_pStr == (char *)0x0) {
            pcVar14 = "";
          }
          bVar4 = crnlib::file_utils::does_file_exist(pcVar14);
          if (!bVar4) goto LAB_0010c075;
          bVar4 = crnlib::command_line_params::get_value_as_bool(this_00,"nooverwrite",0,false);
          if (!bVar4) {
            bVar4 = crnlib::command_line_params::get_value_as_bool(this_00,"timestamp",0,false);
            if (bVar4) {
              pcVar14 = *(char **)((long)&(pfVar1->m_fullname).m_buf_size + lVar15);
              if (pcVar14 == (char *)0x0) {
                pcVar14 = "";
              }
              pcVar17 = local_80.m_pStr;
              if (local_80.m_pStr == (char *)0x0) {
                pcVar17 = "";
              }
              bVar4 = crnlib::file_utils::is_older_than(pcVar14,pcVar17);
              if (bVar4) {
                pcVar14 = local_80.m_pStr;
                if (local_80.m_pStr == (char *)0x0) {
                  pcVar14 = "";
                }
                crnlib::console::warning("Skipping up to date file: %s\n",pcVar14);
                goto LAB_0010bffe;
              }
            }
            goto LAB_0010c075;
          }
          pcVar14 = local_80.m_pStr;
          if (local_80.m_pStr == (char *)0x0) {
            pcVar14 = "";
          }
          crnlib::console::warning("Skipping already existing file: %s\n",pcVar14);
LAB_0010bffe:
          local_120->m_num_skipped = local_120->m_num_skipped + 1;
          bVar4 = false;
          files = local_148;
        }
        if ((local_80.m_pStr != (char *)0x0) &&
           ((*(uint *)(local_80.m_pStr + -8) ^ *(uint *)(local_80.m_pStr + -4)) == 0xffffffff)) {
          crnlib::crnlib_free(local_80.m_pStr + -0x10);
        }
      }
      if ((local_130.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_130.m_pStr + -8) ^ *(uint *)(local_130.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_130.m_pStr + -0x10);
      }
      if ((local_90.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_90.m_pStr + -8) ^ *(uint *)(local_90.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_90.m_pStr + -0x10);
      }
      if ((local_100.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_100.m_pStr + -8) ^ *(uint *)(local_100.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_100.m_pStr + -0x10);
      }
      if ((local_f0.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_f0.m_pStr + -8) ^ *(uint *)(local_f0.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_f0.m_pStr + -0x10);
      }
      if ((local_e0.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_e0.m_pStr + -8) ^ *(uint *)(local_e0.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_e0.m_pStr + -0x10);
      }
      if (bVar4) {
        return false;
      }
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x48;
    } while (uVar16 < files->m_size);
  }
  return true;
}

Assistant:

bool process_files(find_files::file_desc_vec& files) {
    const bool compare_mode = m_params.get_value_as_bool("compare");
    const bool info_mode = m_params.get_value_as_bool("info");

    for (uint32 file_index = 0; file_index < files.size(); file_index++) {
      const find_files::file_desc& file_desc = files[file_index];
      const dynamic_string& in_filename = file_desc.m_fullname;

      dynamic_string in_drive, in_path, in_fname, in_ext;
      file_utils::split_path(in_filename.get_ptr(), &in_drive, &in_path, &in_fname, &in_ext);

      texture_file_types::format out_file_type = texture_file_types::cFormatCRN;
      dynamic_string fmt;
      if (m_params.get_value_as_string("fileformat", 0, fmt)) {
        if (fmt == "tga")
          out_file_type = texture_file_types::cFormatTGA;
        else if (fmt == "bmp")
          out_file_type = texture_file_types::cFormatBMP;
        else if (fmt == "dds")
          out_file_type = texture_file_types::cFormatDDS;
        else if (fmt == "ktx")
          out_file_type = texture_file_types::cFormatKTX;
        else if (fmt == "crn")
          out_file_type = texture_file_types::cFormatCRN;
        else if (fmt == "png")
          out_file_type = texture_file_types::cFormatPNG;
        else {
          console::error("Unsupported output file type: %s", fmt.get_ptr());
          return false;
        }
      }

      // No explicit output format has been specified - try to determine something doable.
      if (!m_params.has_key("fileformat")) {
        if (m_params.has_key("split")) {
          out_file_type = texture_file_types::cFormatPNG;
        } else {
          texture_file_types::format input_file_type = texture_file_types::determine_file_format(in_filename.get_ptr());
          if (input_file_type == texture_file_types::cFormatCRN) {
            out_file_type = texture_file_types::cFormatDDS;
            cfile_stream in_stream;
            crnd::crn_header in_header;
            if (in_stream.open(in_filename.get_ptr()) && in_stream.read(&in_header, sizeof(in_header)) == sizeof(in_header) &&
                (in_header.m_format == cCRNFmtETC1 || in_header.m_format == cCRNFmtETC2 || in_header.m_format == cCRNFmtETC2A || in_header.m_format == cCRNFmtETC1S || in_header.m_format == cCRNFmtETC2AS))
              out_file_type = texture_file_types::cFormatKTX;
          } else if (input_file_type == texture_file_types::cFormatKTX) {
            // Default to converting KTX files to PNG
            out_file_type = texture_file_types::cFormatPNG;
          }
        }
      }

      dynamic_string out_filename;
      if (m_params.get_value_as_bool("outsamedir"))
        out_filename.format("%s%s%s.%s", in_drive.get_ptr(), in_path.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
      else if (m_params.has_key("out")) {
        out_filename = m_params.get_value_as_string_or_empty("out");

        if (files.size() > 1) {
          dynamic_string out_drive, out_dir, out_name, out_ext;
          file_utils::split_path(out_filename.get_ptr(), &out_drive, &out_dir, &out_name, &out_ext);

          out_name.format("%s_%u", out_name.get_ptr(), file_index);

          out_filename.format("%s%s%s%s", out_drive.get_ptr(), out_dir.get_ptr(), out_name.get_ptr(), out_ext.get_ptr());
        }

        if (!m_params.has_key("fileformat"))
          out_file_type = texture_file_types::determine_file_format(out_filename.get_ptr());
      } else {
        dynamic_string out_dir(m_params.get_value_as_string_or_empty("outdir"));

        if (m_params.get_value_as_bool("recreate") && file_desc.m_rel.get_len()) {
          file_utils::combine_path(out_dir, out_dir.get_ptr(), file_desc.m_rel.get_ptr());
        }

        if (out_dir.get_len()) {
          if (file_utils::is_path_separator(out_dir.back()))
            out_filename.format("%s%s.%s", out_dir.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
          else
            out_filename.format("%s\\%s.%s", out_dir.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
        } else {
          out_filename.format("%s.%s", in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
        }

        if (m_params.get_value_as_bool("recreate")) {
          if (file_utils::full_path(out_filename)) {
            if ((!compare_mode) && (!info_mode)) {
              dynamic_string out_drive, out_path;
              file_utils::split_path(out_filename.get_ptr(), &out_drive, &out_path, NULL, NULL);
              out_drive += out_path;
              file_utils::create_path(out_drive.get_ptr());
            }
          }
        }
      }

      if ((!compare_mode) && (!info_mode)) {
        if (file_utils::does_file_exist(out_filename.get_ptr())) {
          if (m_params.get_value_as_bool("nooverwrite")) {
            console::warning("Skipping already existing file: %s\n", out_filename.get_ptr());
            m_num_skipped++;
            continue;
          }

          if (m_params.get_value_as_bool("timestamp")) {
            if (file_utils::is_older_than(in_filename.get_ptr(), out_filename.get_ptr())) {
              console::warning("Skipping up to date file: %s\n", out_filename.get_ptr());
              m_num_skipped++;
              continue;
            }
          }
        }
      }

      convert_status status = cCSFailed;

      if (info_mode)
        status = display_file_info(file_index, files.size(), in_filename.get_ptr());
      else if (compare_mode)
        status = compare_file(file_index, files.size(), in_filename.get_ptr(), out_filename.get_ptr(), out_file_type);
      else if (read_only_file_check(out_filename.get_ptr()))
        status = convert_file(file_index, files.size(), in_filename.get_ptr(), out_filename.get_ptr(), out_file_type);

      m_num_processed++;

      switch (status) {
        case cCSSucceeded: {
          console::info("");
          m_num_succeeded++;
          break;
        }
        case cCSSkipped: {
          console::info("Skipping file.\n");
          m_num_skipped++;
          break;
        }
        case cCSBadParam: {
          return false;
        }
        default: {
          if (!m_params.get_value_as_bool("ignoreerrors"))
            return false;

          console::info("");

          m_num_failed++;
          break;
        }
      }
    }

    return true;
  }